

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::forwardUnsource(DefaultUnfoundedCheck *this,BodyPtr *n,bool add)

{
  bool bVar1;
  NodeId NVar2;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *x_00;
  AtomNode *pAVar3;
  reference pAVar4;
  byte in_DL;
  long *in_RSI;
  long in_RDI;
  NodeId aId;
  NodeId *end;
  NodeId *x;
  NodeId atomId;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  NodeId n_00;
  
  this_00 = (pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            Asp::PrgDepGraph::BodyNode::heads_begin((BodyNode *)*in_RSI);
  x_00 = (pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         Asp::PrgDepGraph::BodyNode::heads_end
                   ((BodyNode *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  do {
    if (this_00 == x_00) {
      return;
    }
    if (*(NodeId *)&(this_00->ebo_).buf != 0) {
      n_00 = *(NodeId *)&(this_00->ebo_).buf;
      atomId = (NodeId)((ulong)in_RDI >> 0x20);
      pAVar3 = Asp::PrgDepGraph::getAtom
                         ((PrgDepGraph *)CONCAT44(n_00,in_stack_ffffffffffffffd0),atomId);
      if ((*(uint *)&(pAVar3->super_Node).field_0x4 & 0xfffffff) !=
          (*(uint *)(*in_RSI + 4) & 0xfffffff)) {
        return;
      }
      pAVar4 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                             *)(in_RDI + 0x28),n_00);
      bVar1 = AtomData::hasSource(pAVar4);
      if (bVar1) {
        pAVar4 = bk_lib::
                 pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                 ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                               *)(in_RDI + 0x28),n_00);
        NVar2 = AtomData::watch(pAVar4);
        if (NVar2 == *(NodeId *)(in_RSI + 1)) {
          pAVar4 = bk_lib::
                   pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                   ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                                 *)(in_RDI + 0x28),n_00);
          AtomData::markSourceInvalid(pAVar4);
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (this_00,(uint *)x_00);
        }
      }
      if ((in_DL & 1) != 0) {
        pAVar4 = bk_lib::
                 pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                 ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                               *)(in_RDI + 0x28),n_00);
        NVar2 = AtomData::watch(pAVar4);
        if (NVar2 == *(NodeId *)(in_RSI + 1)) {
          pushTodo((DefaultUnfoundedCheck *)CONCAT44(n_00,in_stack_ffffffffffffffd0),atomId);
        }
      }
    }
    this_00 = (pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((long)&(this_00->ebo_).buf + 4);
  } while( true );
}

Assistant:

void DefaultUnfoundedCheck::forwardUnsource(const BodyPtr& n, bool add) {
	for (const NodeId* x = n.node->heads_begin(), *end = n.node->heads_end(); x != end; ++x) {
		// Treat disjunctions as separate rules when it comes to source pointer propagation.
		// E.g. a | b :- B is (source) propagated as:
		// a :- B, and
		// b :- B
		if (*x != DependencyGraph::sentinel_atom) {
			NodeId aId = *x;
			if (graph_->getAtom(aId).scc != n.node->scc) {
				break;
			}
			if (atoms_[aId].hasSource() && atoms_[aId].watch() == n.id) {
				atoms_[aId].markSourceInvalid();
				sourceQ_.push_back(aId);
			}
			if (add && atoms_[aId].watch() == n.id) {
				pushTodo(aId);
			}
		}
	}
}